

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Common_Types chaiscript::Boxed_Number::get_common_type(Boxed_Value *t_bv)

{
  bool bVar1;
  Type_Info *pTVar2;
  bad_any_cast *this;
  Type_Info local_230;
  Type_Info local_218;
  Type_Info local_200;
  Type_Info local_1e8;
  Type_Info local_1d0;
  Type_Info local_1b8;
  Type_Info local_1a0;
  Type_Info local_188;
  Type_Info local_170;
  Type_Info local_158;
  Type_Info local_140;
  Type_Info local_128;
  Type_Info local_110;
  Type_Info local_f8;
  Type_Info local_e0;
  Type_Info local_c8;
  Type_Info local_b0;
  Type_Info local_98;
  Type_Info local_80;
  Type_Info local_68;
  Type_Info local_50;
  Type_Info local_38;
  Type_Info *local_20;
  Type_Info *inp_;
  Boxed_Value *t_bv_local;
  
  inp_ = (Type_Info *)t_bv;
  pTVar2 = Boxed_Value::get_type_info(t_bv);
  local_20 = pTVar2;
  user_type<int>();
  bVar1 = Type_Info::operator==(pTVar2,&local_38);
  pTVar2 = local_20;
  if (bVar1) {
    t_bv_local._4_4_ = get_common_type(4,true);
  }
  else {
    user_type<double>();
    bVar1 = Type_Info::operator==(pTVar2,&local_50);
    pTVar2 = local_20;
    if (bVar1) {
      t_bv_local._4_4_ = t_double;
    }
    else {
      user_type<long_double>();
      bVar1 = Type_Info::operator==(pTVar2,&local_68);
      pTVar2 = local_20;
      if (bVar1) {
        t_bv_local._4_4_ = t_long_double;
      }
      else {
        user_type<float>();
        bVar1 = Type_Info::operator==(pTVar2,&local_80);
        pTVar2 = local_20;
        if (bVar1) {
          t_bv_local._4_4_ = t_float;
        }
        else {
          user_type<char>();
          bVar1 = Type_Info::operator==(pTVar2,&local_98);
          pTVar2 = local_20;
          if (bVar1) {
            t_bv_local._4_4_ = get_common_type(1,true);
          }
          else {
            user_type<unsigned_char>();
            bVar1 = Type_Info::operator==(pTVar2,&local_b0);
            pTVar2 = local_20;
            if (bVar1) {
              t_bv_local._4_4_ = get_common_type(1,false);
            }
            else {
              user_type<unsigned_int>();
              bVar1 = Type_Info::operator==(pTVar2,&local_c8);
              pTVar2 = local_20;
              if (bVar1) {
                t_bv_local._4_4_ = get_common_type(4,false);
              }
              else {
                user_type<long>();
                bVar1 = Type_Info::operator==(pTVar2,&local_e0);
                pTVar2 = local_20;
                if (bVar1) {
                  t_bv_local._4_4_ = get_common_type(8,true);
                }
                else {
                  user_type<long_long>();
                  bVar1 = Type_Info::operator==(pTVar2,&local_f8);
                  pTVar2 = local_20;
                  if (bVar1) {
                    t_bv_local._4_4_ = get_common_type(8,true);
                  }
                  else {
                    user_type<unsigned_long>();
                    bVar1 = Type_Info::operator==(pTVar2,&local_110);
                    pTVar2 = local_20;
                    if (bVar1) {
                      t_bv_local._4_4_ = get_common_type(8,false);
                    }
                    else {
                      user_type<unsigned_long_long>();
                      bVar1 = Type_Info::operator==(pTVar2,&local_128);
                      pTVar2 = local_20;
                      if (bVar1) {
                        t_bv_local._4_4_ = get_common_type(8,false);
                      }
                      else {
                        user_type<signed_char>();
                        bVar1 = Type_Info::operator==(pTVar2,&local_140);
                        pTVar2 = local_20;
                        if (bVar1) {
                          t_bv_local._4_4_ = t_int8;
                        }
                        else {
                          user_type<short>();
                          bVar1 = Type_Info::operator==(pTVar2,&local_158);
                          pTVar2 = local_20;
                          if (bVar1) {
                            t_bv_local._4_4_ = t_int16;
                          }
                          else {
                            user_type<int>();
                            bVar1 = Type_Info::operator==(pTVar2,&local_170);
                            pTVar2 = local_20;
                            if (bVar1) {
                              t_bv_local._4_4_ = t_int32;
                            }
                            else {
                              user_type<long>();
                              bVar1 = Type_Info::operator==(pTVar2,&local_188);
                              pTVar2 = local_20;
                              if (bVar1) {
                                t_bv_local._4_4_ = t_int64;
                              }
                              else {
                                user_type<unsigned_char>();
                                bVar1 = Type_Info::operator==(pTVar2,&local_1a0);
                                pTVar2 = local_20;
                                if (bVar1) {
                                  t_bv_local._4_4_ = t_uint8;
                                }
                                else {
                                  user_type<unsigned_short>();
                                  bVar1 = Type_Info::operator==(pTVar2,&local_1b8);
                                  pTVar2 = local_20;
                                  if (bVar1) {
                                    t_bv_local._4_4_ = t_uint16;
                                  }
                                  else {
                                    user_type<unsigned_int>();
                                    bVar1 = Type_Info::operator==(pTVar2,&local_1d0);
                                    pTVar2 = local_20;
                                    if (bVar1) {
                                      t_bv_local._4_4_ = t_uint32;
                                    }
                                    else {
                                      user_type<unsigned_long>();
                                      bVar1 = Type_Info::operator==(pTVar2,&local_1e8);
                                      pTVar2 = local_20;
                                      if (bVar1) {
                                        t_bv_local._4_4_ = t_uint64;
                                      }
                                      else {
                                        user_type<wchar_t>();
                                        bVar1 = Type_Info::operator==(pTVar2,&local_200);
                                        pTVar2 = local_20;
                                        if (bVar1) {
                                          t_bv_local._4_4_ = get_common_type(4,true);
                                        }
                                        else {
                                          user_type<char16_t>();
                                          bVar1 = Type_Info::operator==(pTVar2,&local_218);
                                          pTVar2 = local_20;
                                          if (bVar1) {
                                            t_bv_local._4_4_ = get_common_type(2,false);
                                          }
                                          else {
                                            user_type<char32_t>();
                                            bVar1 = Type_Info::operator==(pTVar2,&local_230);
                                            if (!bVar1) {
                                              this = (bad_any_cast *)__cxa_allocate_exception(8);
                                              memset(this,0,8);
                                              detail::exception::bad_any_cast::bad_any_cast(this);
                                              __cxa_throw(this,&detail::exception::bad_any_cast::
                                                                typeinfo,
                                                          detail::exception::bad_any_cast::
                                                          ~bad_any_cast);
                                            }
                                            t_bv_local._4_4_ = get_common_type(4,false);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return t_bv_local._4_4_;
}

Assistant:

static Common_Types get_common_type(const Boxed_Value &t_bv) {
      const Type_Info &inp_ = t_bv.get_type_info();

      if (inp_ == user_type<int>()) {
        return get_common_type(sizeof(int), true);
      } else if (inp_ == user_type<double>()) {
        return Common_Types::t_double;
      } else if (inp_ == user_type<long double>()) {
        return Common_Types::t_long_double;
      } else if (inp_ == user_type<float>()) {
        return Common_Types::t_float;
      } else if (inp_ == user_type<char>()) {
        return get_common_type(sizeof(char), std::is_signed<char>::value);
      } else if (inp_ == user_type<unsigned char>()) {
        return get_common_type(sizeof(unsigned char), false);
      } else if (inp_ == user_type<unsigned int>()) {
        return get_common_type(sizeof(unsigned int), false);
      } else if (inp_ == user_type<long>()) {
        return get_common_type(sizeof(long), true);
      } else if (inp_ == user_type<long long>()) {
        return get_common_type(sizeof(long long), true);
      } else if (inp_ == user_type<unsigned long>()) {
        return get_common_type(sizeof(unsigned long), false);
      } else if (inp_ == user_type<unsigned long long>()) {
        return get_common_type(sizeof(unsigned long long), false);
      } else if (inp_ == user_type<std::int8_t>()) {
        return Common_Types::t_int8;
      } else if (inp_ == user_type<std::int16_t>()) {
        return Common_Types::t_int16;
      } else if (inp_ == user_type<std::int32_t>()) {
        return Common_Types::t_int32;
      } else if (inp_ == user_type<std::int64_t>()) {
        return Common_Types::t_int64;
      } else if (inp_ == user_type<std::uint8_t>()) {
        return Common_Types::t_uint8;
      } else if (inp_ == user_type<std::uint16_t>()) {
        return Common_Types::t_uint16;
      } else if (inp_ == user_type<std::uint32_t>()) {
        return Common_Types::t_uint32;
      } else if (inp_ == user_type<std::uint64_t>()) {
        return Common_Types::t_uint64;
      } else if (inp_ == user_type<wchar_t>()) {
        return get_common_type(sizeof(wchar_t), std::is_signed<wchar_t>::value);
      } else if (inp_ == user_type<char16_t>()) {
        return get_common_type(sizeof(char16_t), std::is_signed<char16_t>::value);
      } else if (inp_ == user_type<char32_t>()) {
        return get_common_type(sizeof(char32_t), std::is_signed<char32_t>::value);
      } else {
        throw chaiscript::detail::exception::bad_any_cast();
      }
    }